

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint64_t DoBenchmark(Function ToBenchmark,uint64_t Size)

{
  string sVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  int iVar5;
  uniform_int_distribution<int> RandomChar;
  undefined8 in_stack_ffffffffffffff78;
  int iVar6;
  _Alloc_hider in_stack_ffffffffffffff90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50 [2];
  long local_40 [2];
  
  CreateFile(Size);
  iVar5 = (int)Size + -1;
  iVar6 = 0;
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar4 = 1000;
  do {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,filename_abi_cxx11_._M_dataplus._M_p,
               filename_abi_cxx11_._M_dataplus._M_p + filename_abi_cxx11_._M_string_length);
    sVar1._M_string_length._0_4_ = iVar6;
    sVar1._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff78;
    sVar1._M_string_length._4_4_ = iVar5;
    sVar1.field_2._M_allocated_capacity = lVar2;
    sVar1.field_2._8_8_ = in_stack_ffffffffffffff90._M_p;
    (*ToBenchmark)((string *)&stack0xffffffffffffff90,sVar1);
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)&stack0xffffffffffffff80,&Generator,
               (param_type *)&stack0xffffffffffffff80);
    std::__cxx11::string::push_back(-0x70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff90._M_p != &local_60) {
      operator_delete(in_stack_ffffffffffffff90._M_p,local_60._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  lVar3 = std::chrono::_V2::system_clock::now();
  return (lVar3 - lVar2) / 1000000;
}

Assistant:

uint64_t DoBenchmark(Function ToBenchmark, uint64_t Size)
{
    CreateFile(Size);
    std::uniform_int_distribution<> RandomChar(0,Size-1);
    auto start = std::chrono::high_resolution_clock::now();
    for(uint64_t Counter = 0; Counter < TestIterations; Counter++)
    {
        HardToOptimizeOutResultsStorage.push_back(
            ToBenchmark(filename)[RandomChar(Generator)]
        );
    }
    auto stop = std::chrono::high_resolution_clock::now();

    return std::chrono::duration_cast<std::chrono::milliseconds>(stop-start).count();
    CreateFile(0);
}